

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<VkSpecParser::Command>::relocate
          (QArrayDataPointer<VkSpecParser::Command> *this,qsizetype offset,Command **data)

{
  Command *d_first;
  Command *pCVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<VkSpecParser::Command,long_long>(this->ptr,this->size,d_first);
  if (data != (Command **)0x0) {
    pCVar1 = *data;
    if ((this->ptr <= pCVar1) && (pCVar1 < this->ptr + this->size)) {
      *data = pCVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }